

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O0

void __thiscall PowerLightSampling_PdfMethod_Test::TestBody(PowerLightSampling_PdfMethod_Test *this)

{
  bool bVar1;
  float fVar2;
  float in_stack_00000098;
  float in_stack_0000009c;
  char *in_stack_000000a0;
  char *in_stack_000000a8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  optional<pbrt::SampledLight> sampledLight;
  Interaction intr;
  Point3f p;
  int i;
  PowerLightSampler distrib;
  int in_stack_00000284;
  Allocator in_stack_00000288;
  vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> tris;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  Interaction *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  Float in_stack_fffffffffffffce4;
  PowerLightSampler *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf4;
  LightSampleContext *in_stack_fffffffffffffcf8;
  PowerLightSampler *in_stack_fffffffffffffd00;
  Message *in_stack_fffffffffffffd08;
  AssertHelper *in_stack_fffffffffffffd10;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *expression_text;
  AssertionResult *in_stack_fffffffffffffd58;
  AssertHelper *in_stack_fffffffffffffd60;
  AssertionResult local_260;
  uint local_24c;
  string local_248 [48];
  AssertionResult local_218 [4];
  optional local_1d8 [48];
  PowerLightSampler *in_stack_fffffffffffffe58;
  Allocator in_stack_fffffffffffffe60;
  span<const_pbrt::LightHandle> in_stack_fffffffffffffe68;
  int local_134;
  char local_80 [72];
  char local_38 [24];
  char *local_20;
  char local_18 [24];
  
  expression_text = local_18;
  pbrt::RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (uint64_t)in_stack_fffffffffffffcd8);
  local_20 = expression_text;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)0x52d990);
  std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::vector
            ((vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)0x52d99d);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  randomLights(in_stack_00000284,in_stack_00000288);
  actual_predicate_value = local_38;
  std::
  tie<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>>
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffce8,
             (vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  expected_predicate_value = local_80;
  std::
  tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
  ::operator=((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_&,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_&>
               *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
              (tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
               *)in_stack_fffffffffffffcd8);
  std::
  tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
  ::~tuple((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
            *)0x52da0e);
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            ((span<const_pbrt::LightHandle> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffce8);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  pbrt::PowerLightSampler::PowerLightSampler
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  for (local_134 = 0; local_134 < 100; local_134 = local_134 + 1) {
    fVar2 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52da7a);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar2),
                    SUB6416(ZEXT464(0xbf800000),0));
    fVar2 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52dab0);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar2),
                    SUB6416(ZEXT464(0xbf800000),0));
    fVar2 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)0x52dae6);
    vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar2),
                    SUB6416(ZEXT464(0xbf800000),0));
    pbrt::Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (float)((ulong)in_stack_fffffffffffffcd8 >> 0x20),SUB84(in_stack_fffffffffffffcd8,0),
               0.0);
    pbrt::Point3fi::Point3fi
              ((Point3fi *)in_stack_fffffffffffffd00,(Point3f *)in_stack_fffffffffffffcf8);
    pbrt::Normal3<float>::Normal3
              ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (float)((ulong)in_stack_fffffffffffffcd8 >> 0x20),SUB84(in_stack_fffffffffffffcd8,0),
               0.0);
    pbrt::Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (float)((ulong)in_stack_fffffffffffffcd8 >> 0x20),SUB84(in_stack_fffffffffffffcd8,0))
    ;
    pbrt::Interaction::Interaction
              ((Interaction *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               (Point3fi *)in_stack_fffffffffffffce8,
               (Normal3f *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (Point2f *)in_stack_fffffffffffffcd8);
    pbrt::LightSampleContext::LightSampleContext
              ((LightSampleContext *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8);
    pbrt::RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    pbrt::PowerLightSampler::Sample
              (in_stack_fffffffffffffce8,
               (LightSampleContext *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (Float)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    pstd::optional::operator_cast_to_bool(local_1d8);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               SUB81((ulong)in_stack_fffffffffffffcd8 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_218);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd10 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      (int *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd08 =
           testing::Message::operator<<
                     ((Message *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      (char (*) [4])in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd00 =
           (PowerLightSampler *)
           testing::Message::operator<<
                     ((Message *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      (Point3<float> *)in_stack_fffffffffffffcd8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffd58,expression_text,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd10,(Type)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                 (char *)in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      std::__cxx11::string::~string(local_248);
      testing::Message::~Message((Message *)0x52dd8a);
    }
    local_24c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x52de1b);
    if (local_24c == 0) {
      in_stack_fffffffffffffcf8 =
           (LightSampleContext *)
           pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x52de39);
      in_stack_fffffffffffffcf4 =
           (in_stack_fffffffffffffcf8->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      pbrt::LightSampleContext::LightSampleContext
                ((LightSampleContext *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                 ,in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffce8 =
           (PowerLightSampler *)
           pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x52de74);
      pbrt::LightHandle::LightHandle
                ((LightHandle *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (LightHandle *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffce4 =
           pbrt::PowerLightSampler::PDF
                     (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                      (LightHandle *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
      in_stack_fffffffffffffce0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffce0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd10);
        in_stack_fffffffffffffcd8 =
             (Interaction *)testing::AssertionResult::failure_message((AssertionResult *)0x52df46);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd10,(Type)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                   (char *)in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20)
                   ,(char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        testing::Message::~Message((Message *)0x52dfa1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x52dff6);
      local_24c = 0;
    }
    pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x52e00e);
    if (local_24c != 0) goto LAB_0052e05a;
  }
  local_24c = 0;
LAB_0052e05a:
  pbrt::PowerLightSampler::~PowerLightSampler
            ((PowerLightSampler *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::~vector
            ((vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  return;
}

Assistant:

TEST(PowerLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    PowerLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight =
            distrib.Sample(intr, rng.Uniform<Float>());
        ASSERT_TRUE((bool)sampledLight) << i << " - " << p;
        EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}